

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O0

void __thiscall slang::TimeTrace::Profiler::end(Profiler *this)

{
  rep rVar1;
  mutex_type *in_RDI;
  scoped_lock<std::mutex> lock;
  value_type *entry;
  vector<slang::Entry,_std::allocator<slang::Entry>_> *in_stack_ffffffffffffffc0;
  Entry *in_stack_ffffffffffffffc8;
  vector<slang::Entry,_std::allocator<slang::Entry>_> *in_stack_ffffffffffffffd0;
  duration<long,_std::ratio<1L,_1000000L>_> local_28;
  undefined8 local_20;
  rep local_18;
  reference local_10;
  
  stack();
  local_10 = std::vector<slang::Entry,_std::allocator<slang::Entry>_>::back
                       (in_stack_ffffffffffffffc0);
  local_20 = std::chrono::_V2::steady_clock::now();
  local_18 = (rep)std::chrono::operator-
                            (&in_stack_ffffffffffffffc8->start,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_ffffffffffffffc0);
  (local_10->duration).__r = local_18;
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_28);
  if (500 < rVar1) {
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffffc0,in_RDI);
    std::vector<slang::Entry,_std::allocator<slang::Entry>_>::emplace_back<slang::Entry>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x5b9ff7);
  }
  stack();
  std::vector<slang::Entry,_std::allocator<slang::Entry>_>::pop_back
            ((vector<slang::Entry,_std::allocator<slang::Entry>_> *)0x5ba020);
  return;
}

Assistant:

void end() {
        SLANG_ASSERT(!stack.empty());
        SLANG_ASSERT(stack.back().threadId == std::this_thread::get_id());

        auto&& entry = stack.back();
        entry.duration = steady_clock::now() - entry.start;

        // Only include sections longer than 500us.
        if (duration_cast<microseconds>(entry.duration).count() > 500) {
            std::scoped_lock<std::mutex> lock(mut);
            entries.emplace_back(std::move(entry));
        }

        stack.pop_back();
    }